

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,bool skipInitialParam,
          SymbolListCItr currSym,SymbolListCItr endSym)

{
  pointer pbVar1;
  bool bVar2;
  pointer name;
  LibraryIPtr library;
  LogLevel local_fc;
  FunctionMatch match;
  FunctionMatch newMatch;
  char *local_a8;
  __shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> local_60;
  String libraryName;
  
  match.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  match.signature = (FunctionSignature *)0x0;
  match.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (((this->m_error != false) ||
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish == currSym._M_current)) ||
     ((bVar2 = IsOperator((currSym._M_current)->type), bVar2 &&
      ((currSym._M_current)->type != ParenOpen)))) {
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->signature = (FunctionSignature *)0x0;
    (__return_storage_ptr__->partData).
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    match.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    match.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    goto LAB_001ce504;
  }
  CheckLibraryName_abi_cxx11_(&libraryName,this);
  if (libraryName._M_string_length == 0) {
    CheckFunctionCall(&newMatch,this,&this->m_localFunctions,currSym,endSym,skipInitialParam);
    FunctionMatch::operator=(&match,&newMatch);
    std::
    _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ::~_Vector_base(&newMatch.partData.
                     super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   );
    if (match.signature == (FunctionSignature *)0x0) {
      std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_70,
                 &(this->m_library).
                  super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>);
      CheckFunctionCall(&newMatch,this,(LibraryIPtr *)&local_70,currSym,endSym,skipInitialParam);
      FunctionMatch::operator=(&match,&newMatch);
      std::
      _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
      ::~_Vector_base(&newMatch.partData.
                       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                     );
      Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70._M_refcount);
      if (match.signature == (FunctionSignature *)0x0) {
        Runtime::GetLibraryInternal
                  ((Runtime *)&library,
                   (String *)
                   (this->m_runtime).
                   super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   &library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>);
        CheckFunctionCall(&newMatch,this,(LibraryIPtr *)&local_80,currSym,endSym,skipInitialParam);
        FunctionMatch::operator=(&match,&newMatch);
        std::
        _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
        ::~_Vector_base(&newMatch.partData.
                         super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                       );
        Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80._M_refcount);
        if (match.signature == (FunctionSignature *)0x0) {
          name = (this->m_importList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (this->m_importList).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_8192UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_a8 = "Ambiguous function name detected.  Use library name to disambiguate.";
          local_fc = Warning;
          for (; name != pbVar1; name = name + 1) {
            bVar2 = Runtime::LibraryExists
                              ((this->m_runtime).
                               super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr,name);
            if (!bVar2) {
              LogWriteLine(Warning,"Unable to find library \'%s\'",(name->_M_dataplus)._M_p);
              (__return_storage_ptr__->partData).
              super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->partData).
              super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              __return_storage_ptr__->signature = (FunctionSignature *)0x0;
              (__return_storage_ptr__->partData).
              super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_001ce715:
              Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &library.
                          super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              goto LAB_001ce4e0;
            }
            Runtime::GetLibraryInternal
                      ((Runtime *)&newMatch,
                       (String *)
                       (this->m_runtime).
                       super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2> *)&newMatch);
            Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&newMatch.partData);
            std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_90,
                       &library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)
            ;
            CheckFunctionCall(&newMatch,this,(LibraryIPtr *)&local_90,currSym,endSym,
                              skipInitialParam);
            Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_refcount);
            if (newMatch.signature != (FunctionSignature *)0x0) {
              if (match.signature == (FunctionSignature *)0x0) {
                FunctionMatch::operator=(&match,&newMatch);
                if (((match.signature)->m_visibility != Private) ||
                   (library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr == (this->m_library).
                              super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)) goto LAB_001ce6a1;
                local_fc = Error;
                local_a8 = "Unable to call library function with private scope.";
              }
              LogWriteLine(local_fc,local_a8);
              (__return_storage_ptr__->partData).
              super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->partData).
              super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              __return_storage_ptr__->signature = (FunctionSignature *)0x0;
              (__return_storage_ptr__->partData).
              super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              std::
              _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
              ::~_Vector_base(&newMatch.partData.
                               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                             );
              goto LAB_001ce715;
            }
LAB_001ce6a1:
            std::
            _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
            ::~_Vector_base(&newMatch.partData.
                             super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                           );
          }
        }
        goto LAB_001ce40b;
      }
    }
  }
  else if (currSym._M_current + 1 !=
           (this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish) {
    Runtime::GetLibraryInternal
              ((Runtime *)&library,
               (String *)
               (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    std::__shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,
               &library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>);
    CheckFunctionCall(&newMatch,this,(LibraryIPtr *)&local_60,currSym._M_current + 1,endSym,
                      skipInitialParam);
    FunctionMatch::operator=(&match,&newMatch);
    std::
    _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ::~_Vector_base(&newMatch.partData.
                     super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                   );
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_refcount);
LAB_001ce40b:
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &library.super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  __return_storage_ptr__->signature = match.signature;
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       match.partData.
       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       match.partData.
       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->partData).
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       match.partData.
       super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  match.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  match.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  match.partData.
  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001ce4e0:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&libraryName);
LAB_001ce504:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&match.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

inline Parser::FunctionMatch Parser::CheckFunctionCall(bool skipInitialParam, SymbolListCItr currSym, SymbolListCItr endSym) const
	{
		FunctionMatch match;

		// Store current symbol
		auto currentSymbol = currSym;

		// Check for error or invalid symbols
		if (m_error || currentSymbol == m_symbolList.end())
			return match;

		// Any operators other than open parentheses mean this can't be a function call
		if (IsOperator(currentSymbol->type) && (currentSymbol->type != SymbolType::ParenOpen))
			return match;

		// Check for explicit library name in the first symbol.  libraryName is empty if not found.
		String libraryName = CheckLibraryName();

		// Advance the current symbol if we found a valid library name
		if (!libraryName.empty())
		{
			++currentSymbol;
			if (currentSymbol == m_symbolList.end())
				return match;
		}

		// If we explicitly specify a library name, then only look in that library
		if (!libraryName.empty())
		{
			auto library = m_runtime->GetLibraryInternal(libraryName);
			match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
		}
		else
		{
			// Check local function table for signature match
			match = CheckFunctionCall(m_localFunctions, currentSymbol, endSym, skipInitialParam);

			// If not found in local function table, search in libraries for a function match
			if (!match.signature)
			{
				// Check the current library for a signature match
				match = CheckFunctionCall(m_library, currentSymbol, endSym, skipInitialParam);

				// If a library name isn't specified or a signature wasn't found, search first in current library, then in order of imports
				if (!match.signature)
				{
					// Search default library first
					auto library = m_runtime->GetLibraryInternal(libraryName);
					match = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);

					// If function wasn't found in default library, search through all import libraries
					if (!match.signature)
					{
						// Loop through all imported library names
						for (const auto & libName : m_importList)
						{
							// Make sure the library exists
							if (!m_runtime->LibraryExists(libName))
							{
								LogWriteLine(LogLevel::Warning, "Unable to find library '%s'", libName.c_str());
								return FunctionMatch();
							}

							// Search for function in this library
							library = m_runtime->GetLibraryInternal(libName);
							auto newMatch = CheckFunctionCall(library, currentSymbol, endSym, skipInitialParam);
							if (newMatch.signature)
							{
								if (match.signature)
								{
									LogWriteLine(LogLevel::Warning, "Ambiguous function name detected.  Use library name to disambiguate.");
									return FunctionMatch();
								}
								else
								{
									match = newMatch;
									if (match.signature->GetVisibility() == VisibilityType::Private && library != m_library)
									{
										LogWriteLine(LogLevel::Error, "Unable to call library function with private scope.");
										return FunctionMatch();
									}
								}
							}
						}
					}
				}
			}
		}

		return match;
	}